

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::PLP_IP(CPU *this)

{
  uint8_t uVar1;
  CPU *this_local;
  
  this->cycles = 4;
  uVar1 = GetStackByte(this);
  (this->field_6).ps = uVar1;
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::PLP_IP()
{
    cycles = 4;
    ps = GetStackByte();
    cycles--;
}